

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

matches * atomign(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  int iVar2;
  matches *pmVar3;
  match *pmVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  
  if (ctx->reverse == 0) {
    iVar1 = *v;
    iVar7 = iVar1 + 0x3f;
    if (-1 < iVar1) {
      iVar7 = iVar1;
    }
    iVar2 = *(int *)((long)v + 4);
    uVar6 = ~(-1L << ((byte)iVar2 & 0x3f));
    bVar5 = (byte)(iVar1 % 0x40);
    m[iVar7 >> 6] = m[iVar7 >> 6] | uVar6 << (bVar5 & 0x3f);
    if (0x40 < iVar2 + iVar1 % 0x40) {
      m[(long)(iVar7 >> 6) + 1] = m[(long)(iVar7 >> 6) + 1] | uVar6 >> (-bVar5 & 0x3f);
    }
    pmVar3 = (matches *)0x0;
  }
  else {
    pmVar3 = (matches *)calloc(0x10,1);
    pmVar3->mmax = 0x10;
    pmVar4 = (match *)malloc(0xb80);
    pmVar3->m = pmVar4;
    pmVar3->mnum = 1;
    *(undefined8 *)pmVar4 = 0;
    pmVar4->a[0] = 0;
    pmVar4->a[1] = 0;
    pmVar4->m[0] = 0;
    pmVar4->m[1] = 0;
    pmVar4->lpos = spos;
    memset(&pmVar4->field_0x2c,0,0x8c);
  }
  return pmVar3;
}

Assistant:

struct matches *atomign APROTO {
	if (ctx->reverse)
		return alwaysmatches(spos);
	const int *n = v;
	(void)BF(n[0], n[1]);
	return NULL;
}